

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvtBroadphase.cpp
# Opt level: O1

void __thiscall
cbtDbvtTreeCollider::Process(cbtDbvtTreeCollider *this,cbtDbvtNode *na,cbtDbvtNode *nb)

{
  int *piVar1;
  cbtOverlappingPairCache *pcVar2;
  
  if (na != nb) {
    pcVar2 = this->pbp->m_paircache;
    (*(pcVar2->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
              (pcVar2,(na->field_2).childs[0],(nb->field_2).childs[0]);
    piVar1 = &this->pbp->m_newpairs;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void Process(const cbtDbvtNode* na, const cbtDbvtNode* nb)
	{
		if (na != nb)
		{
			cbtDbvtProxy* pa = (cbtDbvtProxy*)na->data;
			cbtDbvtProxy* pb = (cbtDbvtProxy*)nb->data;
#if DBVT_BP_SORTPAIRS
			if (pa->m_uniqueId > pb->m_uniqueId)
				cbtSwap(pa, pb);
#endif
			pbp->m_paircache->addOverlappingPair(pa, pb);
			++pbp->m_newpairs;
		}
	}